

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O0

void __thiscall avro::Validator::doAdvance(Validator *this)

{
  bool bVar1;
  Type TVar2;
  reference this_00;
  type this_01;
  long in_RDI;
  AdvanceFunc func;
  Type type;
  vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_> *local_48;
  vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
  *in_stack_ffffffffffffffc0;
  uint7 in_stack_ffffffffffffffd0;
  byte bVar3;
  
  *(undefined4 *)(in_RDI + 0x14) = 0;
  while( true ) {
    bVar3 = 0;
    if (*(int *)(in_RDI + 0x14) == 0) {
      bVar1 = std::
              vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
              ::empty((vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                       *)(ulong)in_stack_ffffffffffffffd0);
      bVar3 = bVar1 ^ 0xff;
    }
    if ((bVar3 & 1) == 0) break;
    this_00 = std::
              vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
              ::back(in_stack_ffffffffffffffc0);
    this_01 = boost::shared_ptr<avro::Node>::operator->(&this_00->node);
    TVar2 = Node::type(this_01);
    in_stack_ffffffffffffffc0 =
         (vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_> *)
         doAdvance::funcs[(long)TVar2 * 2];
    local_48 = in_stack_ffffffffffffffc0;
    if (((ulong)in_stack_ffffffffffffffc0 & 1) != 0) {
      local_48 = *(vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                   **)((long)in_stack_ffffffffffffffc0 +
                      *(long *)(in_RDI + doAdvance::funcs[(long)TVar2 * 2 + 1]) + -1);
    }
    (*(code *)local_48)((long *)(in_RDI + doAdvance::funcs[(long)TVar2 * 2 + 1]));
  }
  bVar1 = std::vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
          ::empty((vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                   *)CONCAT17(bVar3,in_stack_ffffffffffffffd0));
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0x10) = 7;
  }
  return;
}

Assistant:

void
Validator::doAdvance()
{
    typedef void (Validator::*AdvanceFunc)();

    // only the compound types need advance functions here
    static const AdvanceFunc funcs[] = {
        0, // string
        0, // bytes
        0, // int
        0, // long
        0, // float
        0, // double
        0, // bool
        0, // null
        &Validator::countingAdvance, // Record is treated like counting with count == 1
        &Validator::enumAdvance,
        &Validator::countingAdvance,
        &Validator::countingAdvance,
        &Validator::unionAdvance,
        &Validator::fixedAdvance
    };
    BOOST_STATIC_ASSERT( (sizeof(funcs)/sizeof(AdvanceFunc)) == (AVRO_NUM_TYPES) );

    expectedTypesFlag_ = 0;
    // loop until we encounter a next expected type, or we've exited all compound types 
    while(!expectedTypesFlag_ && !compoundStack_.empty() ) {
    
        Type type = compoundStack_.back().node->type();

        AdvanceFunc func = funcs[type];

        // only compound functions are put on the status stack so it is ok to
        // assume that func is not null
        assert(func);

        ((this)->*(func))();
    }

    if(compoundStack_.empty()) {
        nextType_ = AVRO_NULL;
    }
}